

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

bool __thiscall Js::FunctionBody::DoInterpreterAutoProfile(FunctionBody *this)

{
  uint sourceContextId;
  Utf8SourceInfo *pUVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = DoInterpreterProfile(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1c1f,"(DoInterpreterProfile())","DoInterpreterProfile()");
    if (!bVar3) goto LAB_0077b4c9;
    *puVar4 = 0;
  }
  if (((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 2) == 0) {
    sourceContextId =
         ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
            m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
        (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar3) {
LAB_0077b4c9:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015bbe90,InterpreterAutoProfilePhase,sourceContextId,
                              ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                              ptr)->functionId);
    if (!bVar3) {
      pUVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
      if (((pUVar1->debugModeSource).ptr == (uchar *)0x0) && ((pUVar1->field_0xa8 & 0x20) == 0)) {
        return true;
      }
      return (pUVar1->field_0xa8 & 0x40) == 0;
    }
  }
  return false;
}

Assistant:

bool FunctionBody::DoInterpreterAutoProfile() const
    {
        Assert(DoInterpreterProfile());

#ifdef ASMJS_PLAT
        if (this->GetIsAsmjsMode()) return false;
#endif

        return !PHASE_OFF(InterpreterAutoProfilePhase, this) && !this->IsInDebugMode();
    }